

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

bool tinyusdz::IsUSDA(uint8_t *addr,size_t length)

{
  if (length < 9) {
    return false;
  }
  return addr[8] == '0' && *(long *)addr == 0x2e31206164737523;
}

Assistant:

bool IsUSDA(const uint8_t *addr, const size_t length) {
  if (length < 9) {
    return false;
  }
  const char header[9 + 1] = "#usda 1.0";

  if (memcmp(header, addr, 9) == 0) {
    return true;
  }

  return false;
}